

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

string * __thiscall
util::format<char_const*,char_const(&)[29]>
          (string *__return_storage_ptr__,util *this,char *arg,char (*args) [29])

{
  char *arg_00;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  string local_48;
  undefined1 local_21;
  util *local_20;
  char (*args_local) [29];
  char *arg_local;
  string *s;
  
  local_21 = 0;
  local_20 = (util *)arg;
  args_local = (char (*) [29])this;
  arg_local = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,(char *)this,&local_69);
  to_string(&local_48,&local_68);
  format<char_const*>(&local_a0,local_20,arg_00);
  std::operator+(__return_storage_ptr__,&local_48,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return __return_storage_ptr__;
}

Assistant:

std::string format(T arg, Args&&... args)
{
    using namespace std; // pull in to_string for other types
    std::string s = to_string(arg) + format(std::forward<Args>(args)...);
    return s;
}